

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filecrt.cpp
# Opt level: O3

int CorUnix::InternalMkstemp(char *szNameTemplate)

{
  int iVar1;
  
  iVar1 = mkstemp64(szNameTemplate);
  return iVar1;
}

Assistant:

int
CorUnix::InternalMkstemp(
    char *szNameTemplate
    )
{
    int nRet = -1;
#if MKSTEMP64_IS_USED_INSTEAD_OF_MKSTEMP
    nRet = mkstemp64(szNameTemplate);
#else
    nRet = mkstemp(szNameTemplate);
#endif
    return nRet;
}